

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Appearance_PDU.cpp
# Opt level: O0

KBOOL __thiscall KDIS::PDU::Appearance_PDU::operator==(Appearance_PDU *this,Appearance_PDU *Value)

{
  KBOOL KVar1;
  Appearance_PDU *Value_local;
  Appearance_PDU *this_local;
  
  KVar1 = LE_Header::operator!=(&this->super_LE_Header,&Value->super_LE_Header);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if ((this->m_AppearanceFlag1Union).m_ui8Flag == (Value->m_AppearanceFlag1Union).m_ui8Flag) {
    if ((this->m_AppearanceFlag2Union).m_ui8Flag == (Value->m_AppearanceFlag2Union).m_ui8Flag) {
      if (this->m_ui8ForceID == Value->m_ui8ForceID) {
        KVar1 = DATA_TYPE::EntityType::operator!=(&this->m_EntityType,&Value->m_EntityType);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else {
          KVar1 = DATA_TYPE::EntityType::operator!=(&this->m_AltEntityType,&Value->m_AltEntityType);
          if (KVar1) {
            this_local._7_1_ = false;
          }
          else {
            KVar1 = DATA_TYPE::EntityMarking::operator!=
                              (&this->m_EntityMarking,&Value->m_EntityMarking);
            if (KVar1) {
              this_local._7_1_ = false;
            }
            else {
              KVar1 = DATA_TYPE::EntityCapabilities::operator!=
                                (&this->m_EntityCapabilities,&Value->m_EntityCapabilities);
              if (KVar1) {
                this_local._7_1_ = false;
              }
              else {
                KVar1 = DATA_TYPE::EntityAppearance::operator!=(&this->m_VisApp,&Value->m_VisApp);
                if (KVar1) {
                  this_local._7_1_ = false;
                }
                else {
                  KVar1 = DATA_TYPE::EntityAppearance::operator!=(&this->m_IRApp,&Value->m_IRApp);
                  if (KVar1) {
                    this_local._7_1_ = false;
                  }
                  else {
                    KVar1 = DATA_TYPE::EntityAppearance::operator!=(&this->m_EMApp,&Value->m_EMApp);
                    if (KVar1) {
                      this_local._7_1_ = false;
                    }
                    else {
                      KVar1 = DATA_TYPE::EntityAppearance::operator!=
                                        (&this->m_AudApp,&Value->m_AudApp);
                      if (KVar1) {
                        this_local._7_1_ = false;
                      }
                      else {
                        this_local._7_1_ = true;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL Appearance_PDU::operator == ( const Appearance_PDU & Value ) const
{
    if( LE_Header::operator              != ( Value ) )                              return false;
    if( m_AppearanceFlag1Union.m_ui8Flag != Value.m_AppearanceFlag1Union.m_ui8Flag ) return false;
    if( m_AppearanceFlag2Union.m_ui8Flag != Value.m_AppearanceFlag2Union.m_ui8Flag ) return false;
    if( m_ui8ForceID                     != Value.m_ui8ForceID )                     return false;
    if( m_EntityType                     != Value.m_EntityType )                     return false;
    if( m_AltEntityType                  != Value.m_AltEntityType )                  return false;
    if( m_EntityMarking                  != Value.m_EntityMarking )                  return false;
    if( m_EntityCapabilities             != Value.m_EntityCapabilities )             return false;
    if( m_VisApp                         != Value.m_VisApp )                         return false;
    if( m_IRApp                          != Value.m_IRApp )                          return false;
    if( m_EMApp                          != Value.m_EMApp )                          return false;
    if( m_AudApp                         != Value.m_AudApp )                         return false;
    return true;
}